

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# d_arithmetic.c
# Opt level: O0

t_int * min_perform(t_int *w)

{
  float local_38;
  t_sample g;
  t_sample f;
  int n;
  t_sample *out;
  t_sample *in2;
  t_sample *in1;
  t_int *w_local;
  
  g = (t_sample)w[4];
  _f = (float *)w[3];
  out = (t_sample *)w[2];
  in2 = (t_sample *)w[1];
  while (g != 0.0) {
    local_38 = *out;
    if (*in2 < local_38) {
      local_38 = *in2;
    }
    *_f = local_38;
    g = (t_sample)((int)g + -1);
    _f = _f + 1;
    out = out + 1;
    in2 = in2 + 1;
  }
  return w + 5;
}

Assistant:

t_int *min_perform(t_int *w)
{
    t_sample *in1 = (t_sample *)(w[1]);
    t_sample *in2 = (t_sample *)(w[2]);
    t_sample *out = (t_sample *)(w[3]);
    int n = (int)(w[4]);
    while (n--)
    {
        t_sample f = *in1++, g = *in2++;
        *out++ = (f < g ? f : g);
    }
    return (w+5);
}